

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O1

void convolve_2d_sr_ver_2tap_half_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  int32_t y;
  int16_t *im;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [32];
  int iVar10;
  undefined1 (*pauVar11) [32];
  uint uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  __m128i d0;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar20 [16];
  undefined1 auVar18 [32];
  undefined1 auVar21 [32];
  undefined1 auVar19 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  
  if (w < 0x10) {
    if (w == 2) {
      uVar12 = *(uint *)im_block;
      lVar7 = 0;
      auVar20._8_2_ = 0x10;
      auVar20._0_8_ = 0x10001000100010;
      auVar20._10_2_ = 0x10;
      auVar20._12_2_ = 0x10;
      auVar20._14_2_ = 0x10;
      do {
        auVar19 = vpunpckldq_avx(ZEXT416(uVar12),ZEXT416(*(uint *)(im_block + lVar7 * 2 + 2)));
        uVar12 = *(uint *)(im_block + lVar7 * 2 + 4);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(im_block + lVar7 * 2 + 2);
        auVar19 = vpaddw_avx(auVar19,auVar25);
        auVar19 = vpaddw_avx(auVar19,auVar20);
        auVar19 = vpsraw_avx(auVar19,5);
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        vpextrw_avx(auVar19,0);
        vpextrw_avx(auVar19,1);
        lVar7 = lVar7 + 2;
      } while (h != (int)lVar7);
      return;
    }
    if (w == 4) {
      auVar14 = ZEXT864(*(ulong *)im_block);
      lVar7 = 0;
      auVar19._8_2_ = 0x10;
      auVar19._0_8_ = 0x10001000100010;
      auVar19._10_2_ = 0x10;
      auVar19._12_2_ = 0x10;
      auVar19._14_2_ = 0x10;
      do {
        auVar20 = *(undefined1 (*) [16])(im_block + lVar7 * 4 + 4);
        auVar25 = vpunpcklqdq_avx(auVar14._0_16_,auVar20);
        auVar14._0_16_ = vpsrldq_avx(auVar20,8);
        auVar20 = vpaddw_avx(auVar25,auVar20);
        auVar20 = vpaddw_avx(auVar20,auVar19);
        auVar20 = vpsraw_avx(auVar20,5);
        auVar20 = vpackuswb_avx(auVar20,auVar20);
        *(int *)dst = auVar20._0_4_;
        iVar10 = vpextrw_avx(auVar20,3);
        uVar12 = vpextrw_avx(auVar20,2);
        *(uint *)(dst + dst_stride) = uVar12 | iVar10 << 0x10;
        dst = dst + dst_stride * 2;
        lVar7 = lVar7 + 2;
      } while (h != (int)lVar7);
      return;
    }
    if (w == 8) {
      auVar20 = *(undefined1 (*) [16])im_block;
      pauVar8 = (undefined1 (*) [16])(im_block + 0x10);
      auVar23._8_2_ = 0x10;
      auVar23._0_8_ = 0x10001000100010;
      auVar23._10_2_ = 0x10;
      auVar23._12_2_ = 0x10;
      auVar23._14_2_ = 0x10;
      auVar23._16_2_ = 0x10;
      auVar23._18_2_ = 0x10;
      auVar23._20_2_ = 0x10;
      auVar23._22_2_ = 0x10;
      auVar23._24_2_ = 0x10;
      auVar23._26_2_ = 0x10;
      auVar23._28_2_ = 0x10;
      auVar23._30_2_ = 0x10;
      do {
        auVar22._0_16_ = ZEXT116(0) * pauVar8[-1] + ZEXT116(1) * auVar20;
        auVar22._16_16_ = ZEXT116(1) * pauVar8[-1];
        auVar20 = *pauVar8;
        auVar21 = vpaddw_avx2(auVar22,*(undefined1 (*) [32])(pauVar8 + -1));
        auVar21 = vpaddw_avx2(auVar21,auVar23);
        auVar21 = vpsraw_avx2(auVar21,5);
        auVar21 = vpackuswb_avx2(auVar21,ZEXT1632(auVar20));
        *(long *)dst = auVar21._0_8_;
        *(long *)(dst + dst_stride) = auVar21._16_8_;
        dst = dst + dst_stride * 2;
        pauVar8 = pauVar8 + 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  else {
    if (w == 0x10) {
      auVar23 = *(undefined1 (*) [32])im_block;
      pauVar9 = (undefined1 (*) [32])(im_block + 0x20);
      auVar21._8_2_ = 0x10;
      auVar21._0_8_ = 0x10001000100010;
      auVar21._10_2_ = 0x10;
      auVar21._12_2_ = 0x10;
      auVar21._14_2_ = 0x10;
      auVar21._16_2_ = 0x10;
      auVar21._18_2_ = 0x10;
      auVar21._20_2_ = 0x10;
      auVar21._22_2_ = 0x10;
      auVar21._24_2_ = 0x10;
      auVar21._26_2_ = 0x10;
      auVar21._28_2_ = 0x10;
      auVar21._30_2_ = 0x10;
      do {
        auVar24 = vpaddw_avx2(auVar21,pauVar9[-1]);
        auVar22 = vpaddw_avx2(auVar24,auVar23);
        auVar23 = *pauVar9;
        auVar22 = vpsraw_avx2(auVar22,5);
        auVar24 = vpaddw_avx2(auVar24,auVar23);
        auVar24 = vpsraw_avx2(auVar24,5);
        auVar24 = vpackuswb_avx2(auVar22,auVar24);
        auVar24 = vpermq_avx2(auVar24,0xd8);
        *(undefined1 (*) [16])dst = auVar24._0_16_;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar24._16_16_;
        dst = *(undefined1 (*) [16])dst + dst_stride * 2;
        pauVar9 = pauVar9 + 2;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x20) {
      auVar23 = *(undefined1 (*) [32])im_block;
      auVar21 = *(undefined1 (*) [32])(im_block + 0x10);
      pauVar9 = (undefined1 (*) [32])(im_block + 0x50);
      auVar24._8_2_ = 0x10;
      auVar24._0_8_ = 0x10001000100010;
      auVar24._10_2_ = 0x10;
      auVar24._12_2_ = 0x10;
      auVar24._14_2_ = 0x10;
      auVar24._16_2_ = 0x10;
      auVar24._18_2_ = 0x10;
      auVar24._20_2_ = 0x10;
      auVar24._22_2_ = 0x10;
      auVar24._24_2_ = 0x10;
      auVar24._26_2_ = 0x10;
      auVar24._28_2_ = 0x10;
      auVar24._30_2_ = 0x10;
      do {
        auVar22 = vpaddw_avx2(auVar24,pauVar9[-3]);
        auVar23 = vpaddw_avx2(auVar22,auVar23);
        auVar17 = vpaddw_avx2(auVar24,pauVar9[-2]);
        auVar26 = vpsraw_avx2(auVar23,5);
        auVar23 = vpaddw_avx2(auVar17,auVar21);
        auVar23 = vpsraw_avx2(auVar23,5);
        auVar23 = vpackuswb_avx2(auVar26,auVar23);
        *(undefined1 (*) [32])dst = auVar23;
        auVar23 = pauVar9[-1];
        auVar21 = *pauVar9;
        auVar22 = vpaddw_avx2(auVar22,auVar23);
        auVar26 = vpsraw_avx2(auVar22,5);
        auVar22 = vpaddw_avx2(auVar17,auVar21);
        auVar22 = vpsraw_avx2(auVar22,5);
        auVar22 = vpackuswb_avx2(auVar26,auVar22);
        *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar22;
        dst = *(undefined1 (*) [32])dst + dst_stride * 2;
        pauVar9 = pauVar9 + 4;
        h = h + -2;
      } while (h != 0);
      return;
    }
    if (w == 0x40) {
      auVar21 = *(undefined1 (*) [32])im_block;
      auVar23 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar24 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar22 = *(undefined1 (*) [32])(im_block + 0x30);
      pauVar9 = (undefined1 (*) [32])(im_block + 0xb0);
      pauVar11 = (undefined1 (*) [32])(dst + 0x20);
      auVar17._8_2_ = 0x10;
      auVar17._0_8_ = 0x10001000100010;
      auVar17._10_2_ = 0x10;
      auVar17._12_2_ = 0x10;
      auVar17._14_2_ = 0x10;
      auVar17._16_2_ = 0x10;
      auVar17._18_2_ = 0x10;
      auVar17._20_2_ = 0x10;
      auVar17._22_2_ = 0x10;
      auVar17._24_2_ = 0x10;
      auVar17._26_2_ = 0x10;
      auVar17._28_2_ = 0x10;
      auVar17._30_2_ = 0x10;
      do {
        auVar26 = vpaddw_avx2(auVar17,pauVar9[-7]);
        auVar21 = vpaddw_avx2(auVar26,auVar21);
        auVar21 = vpsraw_avx2(auVar21,5);
        auVar16 = vpaddw_avx2(auVar17,pauVar9[-6]);
        auVar23 = vpaddw_avx2(auVar16,auVar23);
        auVar23 = vpsraw_avx2(auVar23,5);
        auVar23 = vpackuswb_avx2(auVar21,auVar23);
        pauVar11[-1] = auVar23;
        auVar15 = vpaddw_avx2(auVar17,pauVar9[-5]);
        auVar23 = vpaddw_avx2(auVar15,auVar24);
        auVar13 = vpaddw_avx2(auVar17,pauVar9[-4]);
        auVar21 = vpsraw_avx2(auVar23,5);
        auVar23 = vpaddw_avx2(auVar13,auVar22);
        auVar23 = vpsraw_avx2(auVar23,5);
        auVar23 = vpackuswb_avx2(auVar21,auVar23);
        *pauVar11 = auVar23;
        auVar21 = pauVar9[-3];
        auVar23 = pauVar9[-2];
        auVar24 = vpaddw_avx2(auVar26,auVar21);
        auVar22 = vpsraw_avx2(auVar24,5);
        auVar24 = vpaddw_avx2(auVar16,auVar23);
        auVar24 = vpsraw_avx2(auVar24,5);
        auVar24 = vpackuswb_avx2(auVar22,auVar24);
        *(undefined1 (*) [32])(pauVar11[-1] + dst_stride) = auVar24;
        auVar24 = pauVar9[-1];
        auVar22 = *pauVar9;
        auVar26 = vpaddw_avx2(auVar15,auVar24);
        auVar16 = vpsraw_avx2(auVar26,5);
        auVar26 = vpaddw_avx2(auVar13,auVar22);
        auVar26 = vpsraw_avx2(auVar26,5);
        auVar26 = vpackuswb_avx2(auVar16,auVar26);
        *(undefined1 (*) [32])(*pauVar11 + dst_stride) = auVar26;
        pauVar9 = pauVar9 + 8;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + dst_stride * 2);
        h = h + -2;
      } while (h != 0);
      return;
    }
  }
  auVar15 = *(undefined1 (*) [32])im_block;
  auVar23 = *(undefined1 (*) [32])(im_block + 0x10);
  auVar16 = *(undefined1 (*) [32])(im_block + 0x20);
  auVar26 = *(undefined1 (*) [32])(im_block + 0x30);
  auVar17 = *(undefined1 (*) [32])(im_block + 0x40);
  auVar22 = *(undefined1 (*) [32])(im_block + 0x50);
  auVar24 = *(undefined1 (*) [32])(im_block + 0x60);
  auVar21 = *(undefined1 (*) [32])(im_block + 0x70);
  lVar7 = (long)dst_stride;
  pauVar9 = (undefined1 (*) [32])(im_block + 0x170);
  pauVar11 = (undefined1 (*) [32])(dst + 0x60);
  auVar13._8_2_ = 0x10;
  auVar13._0_8_ = 0x10001000100010;
  auVar13._10_2_ = 0x10;
  auVar13._12_2_ = 0x10;
  auVar13._14_2_ = 0x10;
  auVar13._16_2_ = 0x10;
  auVar13._18_2_ = 0x10;
  auVar13._20_2_ = 0x10;
  auVar13._22_2_ = 0x10;
  auVar13._24_2_ = 0x10;
  auVar13._26_2_ = 0x10;
  auVar13._28_2_ = 0x10;
  auVar13._30_2_ = 0x10;
  do {
    auVar18 = vpaddw_avx2(auVar13,pauVar9[-0xf]);
    auVar15 = vpaddw_avx2(auVar18,auVar15);
    auVar15 = vpsraw_avx2(auVar15,5);
    auVar27 = vpaddw_avx2(auVar13,pauVar9[-0xe]);
    auVar23 = vpaddw_avx2(auVar27,auVar23);
    auVar23 = vpsraw_avx2(auVar23,5);
    auVar23 = vpackuswb_avx2(auVar15,auVar23);
    pauVar11[-3] = auVar23;
    auVar1 = vpaddw_avx2(auVar13,pauVar9[-0xd]);
    auVar23 = vpaddw_avx2(auVar1,auVar16);
    auVar16 = vpsraw_avx2(auVar23,5);
    auVar2 = vpaddw_avx2(auVar13,pauVar9[-0xc]);
    auVar23 = vpaddw_avx2(auVar2,auVar26);
    auVar23 = vpsraw_avx2(auVar23,5);
    auVar23 = vpackuswb_avx2(auVar16,auVar23);
    pauVar11[-2] = auVar23;
    auVar3 = vpaddw_avx2(auVar13,pauVar9[-0xb]);
    auVar23 = vpaddw_avx2(auVar3,auVar17);
    auVar17 = vpsraw_avx2(auVar23,5);
    auVar4 = vpaddw_avx2(auVar13,pauVar9[-10]);
    auVar23 = vpaddw_avx2(auVar4,auVar22);
    auVar23 = vpsraw_avx2(auVar23,5);
    auVar23 = vpackuswb_avx2(auVar17,auVar23);
    pauVar11[-1] = auVar23;
    auVar5 = vpaddw_avx2(auVar13,pauVar9[-9]);
    auVar23 = vpaddw_avx2(auVar5,auVar24);
    auVar6 = vpaddw_avx2(auVar13,pauVar9[-8]);
    auVar24 = vpsraw_avx2(auVar23,5);
    auVar23 = vpaddw_avx2(auVar6,auVar21);
    auVar23 = vpsraw_avx2(auVar23,5);
    auVar23 = vpackuswb_avx2(auVar24,auVar23);
    *pauVar11 = auVar23;
    auVar15 = pauVar9[-7];
    auVar23 = pauVar9[-6];
    auVar21 = vpaddw_avx2(auVar18,auVar15);
    auVar24 = vpsraw_avx2(auVar21,5);
    auVar21 = vpaddw_avx2(auVar27,auVar23);
    auVar21 = vpsraw_avx2(auVar21,5);
    auVar21 = vpackuswb_avx2(auVar24,auVar21);
    *(undefined1 (*) [32])(pauVar11[-3] + lVar7) = auVar21;
    auVar16 = pauVar9[-5];
    auVar26 = pauVar9[-4];
    auVar21 = vpaddw_avx2(auVar1,auVar16);
    auVar24 = vpsraw_avx2(auVar21,5);
    auVar21 = vpaddw_avx2(auVar2,auVar26);
    auVar21 = vpsraw_avx2(auVar21,5);
    auVar21 = vpackuswb_avx2(auVar24,auVar21);
    *(undefined1 (*) [32])(pauVar11[-2] + lVar7) = auVar21;
    auVar17 = pauVar9[-3];
    auVar22 = pauVar9[-2];
    auVar21 = vpaddw_avx2(auVar3,auVar17);
    auVar24 = vpsraw_avx2(auVar21,5);
    auVar21 = vpaddw_avx2(auVar4,auVar22);
    auVar21 = vpsraw_avx2(auVar21,5);
    auVar21 = vpackuswb_avx2(auVar24,auVar21);
    *(undefined1 (*) [32])(pauVar11[-1] + lVar7) = auVar21;
    auVar24 = pauVar9[-1];
    auVar21 = *pauVar9;
    auVar18 = vpaddw_avx2(auVar5,auVar24);
    auVar27 = vpsraw_avx2(auVar18,5);
    auVar18 = vpaddw_avx2(auVar6,auVar21);
    auVar18 = vpsraw_avx2(auVar18,5);
    auVar18 = vpackuswb_avx2(auVar27,auVar18);
    *(undefined1 (*) [32])(*pauVar11 + lVar7) = auVar18;
    pauVar9 = pauVar9 + 0x10;
    pauVar11 = (undefined1 (*) [32])(*pauVar11 + dst_stride * 2);
    h = h + -2;
  } while (h != 0);
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_half_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  (void)filter_params_y;
  (void)subpel_y_q4;

  if (w == 2) {
    __m128i s_32[2];

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_2x2_half_pel_sse2(im, s_32);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_2x2_sse2(r, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 4) {
    __m128i s_64[2];

    s_64[0] = _mm_loadl_epi64((__m128i *)im);

    do {
      const __m128i res = xy_y_convolve_2tap_4x2_half_pel_sse2(im, s_64);
      const __m128i r = xy_y_round_half_pel_sse2(res);
      pack_store_4x2_sse2(r, dst, dst_stride);
      im += 2 * 4;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 8) {
    __m128i s_128[2];

    s_128[0] = _mm_loadu_si128((__m128i *)im);

    do {
      const __m256i res = xy_y_convolve_2tap_8x2_half_pel_avx2(im, s_128);
      const __m256i r = xy_y_round_half_pel_avx2(res);
      pack_store_8x2_avx2(r, dst, dst_stride);
      im += 2 * 8;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    __m256i s_256[2], r[2];

    s_256[0] = _mm256_loadu_si256((__m256i *)im);

    do {
      xy_y_convolve_2tap_16x2_half_pel_avx2(im, s_256, r);
      r[0] = xy_y_round_half_pel_avx2(r[0]);
      r[1] = xy_y_round_half_pel_avx2(r[1]);
      xy_y_pack_store_16x2_avx2(r[0], r[1], dst, dst_stride);
      im += 2 * 16;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    __m256i s_256[2][2];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 32, s_256[0], s_256[1], dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 2 * 32, s_256[1], s_256[0],
                                              dst + dst_stride);
      im += 2 * 32;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else if (w == 64) {
    __m256i s_256[2][4];

    s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
    s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
    s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
    s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 64, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 96, s_256[0] + 2,
                                              s_256[1] + 2, dst + 32);
      im += 2 * 64;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i s_256[2][8];

    assert(w == 128);

    load_16bit_8rows_avx2(im, 16, s_256[0]);

    do {
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 128, s_256[0] + 0,
                                              s_256[1] + 0, dst);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 160, s_256[0] + 2,
                                              s_256[1] + 2, dst + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 192, s_256[0] + 4,
                                              s_256[1] + 4, dst + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(im + 224, s_256[0] + 6,
                                              s_256[1] + 6, dst + 3 * 32);
      im += 2 * 128;
      xy_y_convolve_2tap_half_pel_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                              dst + dst_stride);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 32, s_256[1] + 2, s_256[0] + 2, dst + dst_stride + 1 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 64, s_256[1] + 4, s_256[0] + 4, dst + dst_stride + 2 * 32);
      xy_y_convolve_2tap_half_pel_32_all_avx2(
          im + 96, s_256[1] + 6, s_256[0] + 6, dst + dst_stride + 3 * 32);
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  }
}